

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawget(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  Value VVar3;
  int iVar4;
  TValue *pTVar5;
  StkId pTVar6;
  TValue *io_1;
  lua_Integer *data_1;
  uint ukey_1;
  lua_Integer n_1;
  TValue *key_1;
  RaviArray *h_2;
  TValue *io;
  lua_Number *data;
  uint ukey;
  lua_Integer n;
  TValue *key;
  RaviArray *h_1;
  TValue *io2;
  TValue *io1;
  Table *h;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2cb,"int lua_rawget(lua_State *, int)");
  }
  pTVar5 = index2addr(L,idx);
  if ((pTVar5->tt_ & 0xf) != 5) {
    __assert_fail("((((((((t))->tt_)) & 0x0F)) == (5))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x2cd,"int lua_rawget(lua_State *, int)");
  }
  if (pTVar5->tt_ == 0x8005) {
    if (pTVar5->tt_ != 0x8005) {
      __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2cf,"int lua_rawget(lua_State *, int)");
    }
    if (((pTVar5->value_).gc)->tt != '\x05') {
      __assert_fail("(((t)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2cf,"int lua_rawget(lua_State *, int)");
    }
    pTVar1 = L->top;
    pTVar6 = pTVar1 + -1;
    pTVar5 = luaH_get((Table *)(pTVar5->value_).gc,L->top + -1);
    pTVar6->value_ = pTVar5->value_;
    pTVar1[-1].tt_ = pTVar5->tt_;
    if ((pTVar1[-1].tt_ & 0x8000) != 0) {
      if ((pTVar1[-1].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2d0,"int lua_rawget(lua_State *, int)");
      }
      if ((pTVar1[-1].tt_ & 0x7f) != (ushort)((pTVar6->value_).gc)->tt) {
LAB_00112364:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2d0,"int lua_rawget(lua_State *, int)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1[-1].tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x2d0,"int lua_rawget(lua_State *, int)");
        }
        if ((((pTVar6->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00112364;
      }
    }
  }
  else if (pTVar5->tt_ == 0x8025) {
    if ((pTVar5->tt_ != 0x8015) && (pTVar5->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2d3,"int lua_rawget(lua_State *, int)");
    }
    if ((((pTVar5->value_).gc)->tt != '\x15') && (((pTVar5->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2d3,"int lua_rawget(lua_State *, int)");
    }
    p_Var2 = (pTVar5->value_).f;
    pTVar1 = L->top;
    if (pTVar1[-1].tt_ != 0x13) {
      __assert_fail("(((((key))->tt_) == (((3) | ((1) << 4))))) && \"key must be integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2d5,"int lua_rawget(lua_State *, int)");
    }
    if (pTVar1[-1].tt_ == 0x13) {
      if (pTVar1[-1].tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2d7,"int lua_rawget(lua_State *, int)");
      }
      VVar3 = pTVar1[-1].value_;
      if ((long)(ulong)(*(int *)(p_Var2 + 0xc) - 1) < VVar3.i) {
        pTVar1[-1].tt_ = 0;
      }
      else {
        if (*(uint *)(p_Var2 + 0xc) <= (uint)VVar3.b) {
          luaG_runerror(L,"array out of bounds");
        }
        pTVar1[-1].value_ = *(Value *)(*(long *)(p_Var2 + 0x30) + (VVar3.i & 0xffffffffU) * 8);
        pTVar1[-1].tt_ = 3;
      }
    }
    else {
      pTVar1[-1].tt_ = 0;
    }
  }
  else {
    if ((pTVar5->tt_ != 0x8015) && (pTVar5->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2e2,"int lua_rawget(lua_State *, int)");
    }
    if ((((pTVar5->value_).gc)->tt != '\x15') && (((pTVar5->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2e2,"int lua_rawget(lua_State *, int)");
    }
    p_Var2 = (pTVar5->value_).f;
    pTVar1 = L->top;
    if (pTVar1[-1].tt_ != 0x13) {
      __assert_fail("(((((key))->tt_) == (((3) | ((1) << 4))))) && \"key must be integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x2e4,"int lua_rawget(lua_State *, int)");
    }
    if (pTVar1[-1].tt_ == 0x13) {
      if (pTVar1[-1].tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x2e6,"int lua_rawget(lua_State *, int)");
      }
      VVar3 = pTVar1[-1].value_;
      if ((long)(ulong)(*(int *)(p_Var2 + 0xc) - 1) < VVar3.i) {
        pTVar1[-1].tt_ = 0;
      }
      else {
        if (*(uint *)(p_Var2 + 0xc) <= (uint)VVar3.b) {
          luaG_runerror(L,"array out of bounds");
        }
        pTVar1[-1].value_ = *(Value *)(*(long *)(p_Var2 + 0x30) + (VVar3.i & 0xffffffffU) * 8);
        pTVar1[-1].tt_ = 0x13;
      }
    }
    else {
      pTVar1[-1].tt_ = 0;
    }
  }
  iVar4 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar4;
  if (iVar4 == 0) {
    return L->top[-1].tt_ & 0xf;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x2f0,"int lua_rawget(lua_State *, int)");
}

Assistant:

LUA_API int lua_rawget(lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  if (ttisLtable(t)) {
      Table* h = hvalue(t);
      setobj2s(L, L->top - 1, luaH_get(h, L->top - 1));
  }
  else if (ttisfarray(t)) {
    RaviArray* h = arrvalue(t);
    TValue *key = L->top - 1;
    api_check(L, ttisinteger(key), "key must be integer");
    if (ttisinteger(key)) {
      lua_Integer n = ivalue(key);
      if (n <= raviH_getn(h)) { raviH_get_float_inline(L, h, n, key); }
      else {
        setnilvalue(key);
      }
    }
    else {
      setnilvalue(key);
    }
  }
  else {
    RaviArray* h = arrvalue(t);
    TValue *key = L->top - 1;
    api_check(L, ttisinteger(key), "key must be integer");
    if (ttisinteger(key)) {
      lua_Integer n = ivalue(key);
      if (n <= raviH_getn(h)) { raviH_get_int_inline(L, h, n, key); }
      else {
        setnilvalue(key);
      }
    }
    else {
      setnilvalue(key);
    }
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}